

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relax_float_ops_pass.cpp
# Opt level: O1

bool __thiscall
spvtools::opt::RelaxFloatOpsPass::ProcessInst(RelaxFloatOpsPass *this,Instruction *r_inst)

{
  IRContext *this_00;
  bool bVar1;
  uint32_t r_id;
  
  r_id = 0;
  if (r_inst->has_result_id_ == true) {
    r_id = Instruction::GetSingleWordOperand(r_inst,(uint)r_inst->has_type_id_);
  }
  if ((((r_id != 0) && (bVar1 = IsFloat32(this,r_inst), bVar1)) &&
      (bVar1 = IsRelaxed(this,r_id), !bVar1)) && (bVar1 = IsRelaxable(this,r_inst), bVar1)) {
    this_00 = (this->super_Pass).context_;
    if ((this_00->valid_analyses_ & kAnalysisDecorations) == kAnalysisNone) {
      IRContext::BuildDecorationManager(this_00);
    }
    analysis::DecorationManager::AddDecoration
              ((this_00->decoration_mgr_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::analysis::DecorationManager,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::analysis::DecorationManager_*,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
               .super__Head_base<0UL,_spvtools::opt::analysis::DecorationManager_*,_false>.
               _M_head_impl,r_id,0);
    return true;
  }
  return false;
}

Assistant:

bool RelaxFloatOpsPass::ProcessInst(Instruction* r_inst) {
  uint32_t r_id = r_inst->result_id();
  if (r_id == 0) return false;
  if (!IsFloat32(r_inst)) return false;
  if (IsRelaxed(r_id)) return false;
  if (!IsRelaxable(r_inst)) return false;
  get_decoration_mgr()->AddDecoration(
      r_id, uint32_t(spv::Decoration::RelaxedPrecision));
  return true;
}